

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_draw_index * nk_draw_list_alloc_elements(nk_draw_list *list,nk_size count)

{
  nk_draw_command *pnVar1;
  int in_ESI;
  nk_draw_list *in_RDI;
  nk_draw_command *cmd;
  nk_draw_index *ids;
  nk_size in_stack_00000030;
  nk_size in_stack_00000038;
  nk_buffer_allocation_type in_stack_00000044;
  nk_buffer *in_stack_00000048;
  nk_draw_index *local_8;
  
  if (in_RDI == (nk_draw_list *)0x0) {
    local_8 = (nk_draw_index *)0x0;
  }
  else {
    local_8 = (nk_draw_index *)
              nk_buffer_alloc(in_stack_00000048,in_stack_00000044,in_stack_00000038,
                              in_stack_00000030);
    if (local_8 == (nk_draw_index *)0x0) {
      local_8 = (nk_draw_index *)0x0;
    }
    else {
      pnVar1 = nk_draw_list_command_last(in_RDI);
      in_RDI->element_count = in_ESI + in_RDI->element_count;
      pnVar1->elem_count = in_ESI + pnVar1->elem_count;
    }
  }
  return local_8;
}

Assistant:

NK_INTERN nk_draw_index*
nk_draw_list_alloc_elements(struct nk_draw_list *list, nk_size count)
{
nk_draw_index *ids;
struct nk_draw_command *cmd;
NK_STORAGE const nk_size elem_align = NK_ALIGNOF(nk_draw_index);
NK_STORAGE const nk_size elem_size = sizeof(nk_draw_index);
NK_ASSERT(list);
if (!list) return 0;

ids = (nk_draw_index*)
nk_buffer_alloc(list->elements, NK_BUFFER_FRONT, elem_size*count, elem_align);
if (!ids) return 0;
cmd = nk_draw_list_command_last(list);
list->element_count += (unsigned int)count;
cmd->elem_count += (unsigned int)count;
return ids;
}